

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_5.cpp
# Opt level: O1

bool __thiscall Date::is_valid(Date *this)

{
  uint uVar1;
  Month MVar2;
  int iVar3;
  bool bVar4;
  
  uVar1 = this->y;
  if (0 < (int)uVar1) {
    MVar2 = this->m;
    iVar3 = this->d;
    if (0 < iVar3 && MVar2 - jan < 0xc) {
      if ((((byte)(0x5ab >> ((byte)MVar2 & 0x1f)) | nov < MVar2) & iVar3 < 0x20) != 0) {
        return true;
      }
      if (((byte)(0xa50 >> ((byte)MVar2 & 0x1f)) & MVar2 < dec & iVar3 < 0x1f) != 0) {
        return true;
      }
      if (MVar2 == feb) {
        if ((uVar1 & 3) == 0) {
          bVar4 = true;
          if ((uVar1 * -0x3d70a3d7 >> 2 | uVar1 * 0x40000000) < 0x28f5c29) {
            bVar4 = (uVar1 * -0x3d70a3d7 >> 4 | uVar1 * -0x70000000) < 0xa3d70b;
          }
        }
        else {
          bVar4 = false;
        }
        if ((bool)(bVar4 & iVar3 < 0x1e)) {
          return true;
        }
      }
      return iVar3 < 0x1d;
    }
  }
  return false;
}

Assistant:

bool Date::is_valid()
{
	bool is_valid = y > 0 && (int(m) > 0 && int(m) < 13) && d > 0;
	is_valid = is_valid && (
		(is_31_day_month(m) && d < 32) ||
		(is_30_day_month(m) && d < 31) ||
		(m == Month::feb && (is_leap(y) && d < 30) || d < 29)
		);
	return is_valid;
}